

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfsbfs.cpp
# Opt level: O2

void count_components(void)

{
  int iVar1;
  int i;
  size_type __n;
  reference rVar2;
  
  freopen("components.txt","w",_stdout);
  std::vector<bool,_std::allocator<bool>_>::resize
            ((vector<bool,_std::allocator<bool>_> *)(anonymous_namespace)::useddfs,(long)V,false);
  iVar1 = 0;
  for (__n = 0; (long)__n < (long)V; __n = __n + 1) {
    rVar2 = std::vector<bool,_std::allocator<bool>_>::operator[]
                      ((vector<bool,_std::allocator<bool>_> *)(anonymous_namespace)::useddfs,__n);
    if ((*rVar2._M_p & rVar2._M_mask) == 0) {
      if (DAT_0011f3a8 != (anonymous_namespace)::comp) {
        DAT_0011f3a8 = (anonymous_namespace)::comp;
      }
      dfs(0);
      iVar1 = iVar1 + 1;
    }
  }
  std::ostream::operator<<((ostream *)&std::cout,iVar1);
  return;
}

Assistant:

void count_components() {
    freopen("components.txt", "w", stdout); // output file

    int comp_num = 0;
    useddfs.resize(V, false);
    for (int i = 0; i < V; i++) {
        if (!useddfs[i]) {
            comp.clear();
            dfs(i);
            comp_num++;
        }
    }
    cout << comp_num;
}